

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bidi_test.c
# Opt level: O1

void run_test(char *filename,uint lineno,bidi_char *bcs,size_t bcs_len,uint *order,size_t order_len,
             int override)

{
  byte bVar1;
  bool bVar2;
  void *__dest;
  size_t sVar3;
  void *ptr;
  char *pcVar4;
  char *pcVar5;
  unsigned_short *puVar6;
  uint *puVar7;
  wchar_t *pwVar8;
  size_t sVar9;
  
  __dest = safemalloc(bcs_len,0xc,0);
  if (bcs_len != 0) {
    memcpy(__dest,bcs,bcs_len * 0xc);
  }
  sVar3 = do_bidi_test(ctx,bcs,bcs_len,override);
  sVar9 = 0;
  ptr = safemalloc(sVar3,4,0);
  if (sVar3 != 0) {
    puVar6 = &bcs->index;
    sVar9 = 0;
    do {
      bVar1 = bidi_getType(*(wchar_t *)(puVar6 + -2));
      if ((0x402c6U >> (bVar1 & 0x1f) & 1) == 0) {
        *(uint *)((long)ptr + sVar9 * 4) = (uint)*puVar6;
        sVar9 = sVar9 + 1;
      }
      puVar6 = puVar6 + 6;
      sVar3 = sVar3 - 1;
    } while (sVar3 != 0);
  }
  if (sVar9 == order_len) {
    if (sVar9 != 0) {
      bVar2 = true;
      sVar3 = 0;
      do {
        if (*(uint *)((long)ptr + sVar3 * 4) != order[sVar3]) {
          bVar2 = false;
        }
        sVar3 = sVar3 + 1;
      } while (sVar9 != sVar3);
      if (!bVar2) goto LAB_00101d1f;
    }
    pass = pass + 1;
  }
  else {
LAB_00101d1f:
    fail = fail + 1;
    printf("%s:%u: failed order\n",filename,(ulong)lineno);
    printf("  input chars:");
    if (bcs_len != 0) {
      puVar7 = (uint *)((long)__dest + 4);
      sVar3 = bcs_len;
      do {
        printf(" %04x",(ulong)*puVar7);
        puVar7 = puVar7 + 3;
        sVar3 = sVar3 - 1;
      } while (sVar3 != 0);
    }
    putchar(10);
    printf("  classes:    ");
    if (bcs_len != 0) {
      pwVar8 = (wchar_t *)((long)__dest + 4);
      sVar3 = bcs_len;
      do {
        bVar1 = bidi_getType(*pwVar8);
        printf(" %-4s",typenames[bVar1]);
        pwVar8 = pwVar8 + 3;
        sVar3 = sVar3 - 1;
      } while (sVar3 != 0);
    }
    putchar(10);
    pcVar4 = "RTL";
    if (override == 0) {
      pcVar4 = "auto";
    }
    pcVar5 = "LTR";
    if (override < 1) {
      pcVar5 = pcVar4;
    }
    printf("  para level = %s\n",pcVar5);
    printf("  expected:");
    if (order_len != 0) {
      sVar3 = 0;
      do {
        printf(" %u",(ulong)order[sVar3]);
        sVar3 = sVar3 + 1;
      } while (order_len != sVar3);
    }
    putchar(10);
    printf("  got:     ");
    if (sVar9 != 0) {
      sVar3 = 0;
      do {
        printf(" %u",(ulong)*(uint *)((long)ptr + sVar3 * 4));
        sVar3 = sVar3 + 1;
      } while (sVar9 != sVar3);
    }
    putchar(10);
  }
  memcpy(bcs,__dest,bcs_len * 0xc);
  safefree(__dest);
  safefree(ptr);
  return;
}

Assistant:

static void run_test(const char *filename, unsigned lineno,
                     bidi_char *bcs, size_t bcs_len,
                     const unsigned *order, size_t order_len,
                     int override)
{
    size_t bcs_orig_len = bcs_len;
    bidi_char *bcs_orig = snewn(bcs_orig_len, bidi_char);
    if (bcs_orig_len)
        memcpy(bcs_orig, bcs, bcs_orig_len * sizeof(bidi_char));

    bcs_len = do_bidi_test(ctx, bcs, bcs_len, override);

    /*
     * TR9 revision 44 rule X9 says we remove explicit embedding
     * controls and BN characters. So the test cases don't list them
     * in the expected outputs. Do the same to our own output - unless
     * we're testing the standard version of the algorithm, in which
     * case, we expect the output to be exactly as the test cases say.
     */
    unsigned *our_order = snewn(bcs_len, unsigned);
    size_t our_order_len = 0;
    for (size_t i = 0; i < bcs_len; i++) {
        BidiType t = bidi_getType(bcs[i].wc);
#ifndef REMOVE_FORMATTING_CHARS
        if (typeIsRemovedDuringProcessing(t))
            continue;
#endif
        our_order[our_order_len++] = bcs[i].index;
    }

    bool ok = false;
    if (our_order_len == order_len) {
        ok = true;
        for (size_t i = 0; i < our_order_len; i++)
            if (our_order[i] != order[i])
                ok = false;
    }
    if (ok) {
        pass++;
    } else {
        fail++;
        printf("%s:%u: failed order\n", filename, lineno);
        printf("  input chars:");
        for (size_t i = 0; i < bcs_orig_len; i++)
            printf(" %04x", bcs_orig[i].wc);
        printf("\n");
        printf("  classes:    ");
        for (size_t i = 0; i < bcs_orig_len; i++)
            printf(" %-4s", typenames[bidi_getType(bcs_orig[i].wc)]);
        printf("\n");
        printf("  para level = %s\n",
               override > 0 ? "LTR" : override < 0 ? "RTL" : "auto");
        printf("  expected:");
        for (size_t i = 0; i < order_len; i++)
            printf(" %u", order[i]);
        printf("\n");
        printf("  got:     ");
        for (size_t i = 0; i < our_order_len; i++)
            printf(" %u", our_order[i]);
        printf("\n");
    }

    /* Put the original data back so we can re-test with another override */
    memcpy(bcs, bcs_orig, bcs_orig_len * sizeof(bidi_char));

    sfree(bcs_orig);
    sfree(our_order);
}